

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerConvNum(Lowerer *this,Instr *instrLoad,bool noMathFastPath)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  RegOpnd *this_00;
  LabelInstr *labelTarget;
  LabelInstr *instr;
  
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,OtherFastPathPhase,sourceContextId,functionId);
  if (!bVar1 && !noMathFastPath) {
    bVar1 = IR::Opnd::IsRegOpnd(instrLoad->m_src1);
    if (bVar1) {
      this_00 = IR::Opnd::AsRegOpnd(instrLoad->m_src1);
      bVar1 = IR::Opnd::IsTaggedInt(&this_00->super_Opnd);
      if (bVar1) {
        InsertMove(instrLoad->m_dst,&this_00->super_Opnd,instrLoad,true);
        IR::Instr::Remove(instrLoad);
        return;
      }
      bVar1 = IR::Opnd::IsNotInt(&this_00->super_Opnd);
      if (!bVar1) {
        InsertMove(instrLoad->m_dst,&this_00->super_Opnd,instrLoad,true);
        labelTarget = IR::LabelInstr::New(Label,this->m_func,false);
        bVar1 = LowererMD::GenerateObjectTest
                          (&this->m_lowererMD,&this_00->super_Opnd,instrLoad,labelTarget,false);
        if (bVar1) {
          instr = IR::LabelInstr::New(Label,this->m_func,true);
          IR::Instr::InsertBefore(instrLoad,&instr->super_Instr);
        }
        if (labelTarget != (LabelInstr *)0x0) {
          IR::Instr::InsertAfter(instrLoad,&labelTarget->super_Instr);
        }
      }
    }
  }
  LowerUnaryHelperMemWithTemp2(this,instrLoad,HelperOp_ConvNumber_Full,HelperOp_ConvNumberInPlace);
  return;
}

Assistant:

void
Lowerer::LowerConvNum(IR::Instr *instrLoad, bool noMathFastPath)
{
    if (PHASE_OFF(Js::OtherFastPathPhase, this->m_func) || noMathFastPath || !instrLoad->GetSrc1()->IsRegOpnd())
    {
        this->LowerUnaryHelperMemWithTemp2(instrLoad, IR_HELPER_OP_FULL_OR_INPLACE(ConvNumber));
        return;
    }

    //      MOV dst, src1
    //      TEST src1, 1
    //      JNE $done
    //      call ToNumber
    //$done:

    bool isInt = false;
    bool isNotInt = false;
    IR::RegOpnd *src1 = instrLoad->GetSrc1()->AsRegOpnd();
    IR::LabelInstr *labelDone = NULL;
    IR::Instr *instr;

    if (src1->IsTaggedInt())
    {
        isInt = true;
    }
    else if (src1->IsNotInt())
    {
        isNotInt = true;
    }
    if (!isNotInt)
    {
        //      MOV dst, src1

        instr = Lowerer::InsertMove(instrLoad->GetDst(), src1, instrLoad);

        if (!isInt)
        {
            labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            bool didTest = m_lowererMD.GenerateObjectTest(src1, instrLoad, labelDone);

            if (didTest)
            {
                // This label is needed only to mark the helper block
                IR::LabelInstr * labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
                instrLoad->InsertBefore(labelHelper);
            }
        }
    }

    if (!isInt)
    {
        if (labelDone)
        {
            instrLoad->InsertAfter(labelDone);
        }
        this->LowerUnaryHelperMemWithTemp2(instrLoad, IR_HELPER_OP_FULL_OR_INPLACE(ConvNumber));
    }
    else
    {
        instrLoad->Remove();
    }
}